

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configuration.cc
# Opt level: O0

void __thiscall
gss::UnsupportedConfiguration::UnsupportedConfiguration
          (UnsupportedConfiguration *this,string *message)

{
  exception *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000028;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000030;
  
  std::exception::exception(in_RDI);
  *(undefined ***)in_RDI = &PTR__UnsupportedConfiguration_001df7b0;
  std::__cxx11::string::string(in_stack_00000030,in_stack_00000028);
  return;
}

Assistant:

UnsupportedConfiguration::UnsupportedConfiguration(const string & message) noexcept :
    _what(message)
{
}